

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  iterator iVar2;
  bool bVar3;
  pair<const_int,_int> pVar4;
  int i;
  int index;
  char *pcVar5;
  pair<const_int,_int> *set;
  SetKey *set_00;
  SelectKey SVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  TypeParam ht_in;
  TypeParam ht_out;
  stringstream string_buffer;
  Hasher local_368;
  undefined1 local_358 [8];
  undefined8 local_350;
  AssertHelper local_348;
  SetKey local_339;
  iterator local_338;
  const_reference local_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  ulong local_2c8;
  float local_2c0;
  float local_2bc;
  undefined1 local_2b8;
  undefined8 local_2a0;
  sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
  local_298 [56];
  ulong local_260;
  undefined **local_250;
  undefined1 local_248 [144];
  pair<google::sparse_hashtable_iterator<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_1b8;
  ios_base local_138 [264];
  
  local_2e8._0_4_ = 0;
  local_2e8._4_4_ = 0;
  local_2e8._8_4_ = 0;
  local_338.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)0x0;
  local_338.pos.row_begin._M_current = local_338.pos.row_begin._M_current & 0xffffffff00000000;
  local_1b8.first.ht._0_4_ = 0;
  local_1b8.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_250 = &PTR__BaseHashtableInterface_00c15d98;
  set = (pair<const_int,_int> *)&local_368;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_248,0,(Hasher *)local_2e8,(Hasher *)&local_338,(SelectKey *)local_358,
                     (SetKey *)set,(Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_1b8);
  local_250 = &PTR__BaseHashtableInterface_00c15d18;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(2000);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_248);
  local_248[0x2a] = true;
  local_248._60_4_ = pVar4.first;
  index = 1;
  do {
    local_2e8._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(index);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_248,1);
    google::
    sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize(&local_1b8,
                      (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                       *)local_248,(const_reference)local_2e8);
    index = index + 1;
  } while (index != 100);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x38);
  local_1b8.first.ht._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_248,(key_type *)&local_1b8);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x16);
  local_1b8.first.ht._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *)local_248,(key_type *)&local_1b8);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                    *)local_248);
  bVar3 = google::
          sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
          ::
          serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                    ((sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
                      *)(local_248 + 0x48));
  local_338.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT71(local_338.ht._1_7_,bVar3);
  local_338.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e8,(internal *)&local_338,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &string_buffer)","false"
               ,"true",(char *)set);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x527,(char *)local_2e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if ((undefined1 *)local_2e8._0_8_ != local_2d8) {
      operator_delete((void *)local_2e8._0_8_);
    }
    if (local_358 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_358 + 8))();
    }
    iVar2._M_current = local_338.pos.row_begin._M_current;
    if (local_338.pos.row_begin._M_current !=
        (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if ((local_338.pos.row_begin._M_current)->group !=
          (pointer)&((local_338.pos.row_begin._M_current)->settings).
                    super_alloc_impl<Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
                    .super_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>.
                    count_) {
        operator_delete((local_338.pos.row_begin._M_current)->group);
      }
      operator_delete(iVar2._M_current);
    }
  }
  local_358 = (undefined1  [8])0x0;
  local_350 = (undefined8 *)((ulong)local_350._4_4_ << 0x20);
  local_368.id_ = 0;
  local_368.num_hashes_ = 0;
  local_368.num_compares_ = 0;
  local_338.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)((ulong)local_338.ht & 0xffffffff00000000);
  local_338.pos.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_00 = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_2e8 + 8);
  local_2e8._0_8_ = &PTR__BaseHashtableInterface_00c15d98;
  set_00 = &local_339;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_00,0,(Hasher *)local_358,&local_368,(SelectKey *)&local_348,set_00,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_338);
  local_2e8._0_8_ = &PTR__BaseHashtableInterface_00c15d18;
  local_2a0 = 0;
  bVar3 = google::
          sparsetable<std::pair<int_const,int>,(unsigned_short)48,Alloc<std::pair<int_const,int>,unsigned_long,18446744073709551615ul>>
          ::
          unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,std::__cxx11::stringstream>
                    (local_298,&local_1b8);
  local_2c0 = local_2c0 * (float)local_260;
  local_2d8._8_8_ = (undefined8)local_2c0;
  local_2d8._8_8_ =
       (long)(local_2c0 - 9.223372e+18) & (long)local_2d8._8_8_ >> 0x3f | local_2d8._8_8_;
  local_2bc = (float)local_260 * local_2bc;
  local_2c8 = (ulong)local_2bc;
  local_2c8 = (long)(local_2bc - 9.223372e+18) & (long)local_2c8 >> 0x3f | local_2c8;
  local_2b8 = 0;
  local_358[0] = (SelectKey)bVar3;
  local_350 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)
               "ht_in.unserialize(typename TypeParam::NopointerSerializer(), &string_buffer)",
               "false","true",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52b,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((pair<const_int,_int>)local_368._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    puVar1 = local_350;
    if (local_350 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_350 != local_350 + 2) {
        operator_delete((undefined8 *)*local_350);
      }
      operator_delete(puVar1);
    }
  }
  local_368._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(1);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_348.data_._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_338,this_00,(int *)&local_348);
  local_2f0 = (const_reference)local_2e8;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_358,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (pair<const_int,_int> *)&local_368,local_338.pos.col_current);
  if (local_358[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_350 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_350;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_338.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  local_368._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(99);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(99);
  local_348.data_._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_338,this_00,(int *)&local_348);
  local_2f0 = (const_reference)local_2e8;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_358,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (pair<const_int,_int> *)&local_368,local_338.pos.col_current);
  if (local_358[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_350 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_350;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_338.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(100);
  local_338.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_338.ht._4_4_,pVar4.first);
  pVar7 = google::
          sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_00,(int *)&local_338);
  bVar3 = pVar7.first == 0xffffffffffffffff;
  local_358[0] = (SelectKey)bVar3;
  local_350 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",(char *)set_00)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x52f,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((pair<const_int,_int>)local_368._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    puVar1 = local_350;
    if (local_350 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_350 != local_350 + 2) {
        operator_delete((undefined8 *)*local_350);
      }
      operator_delete(puVar1);
    }
  }
  local_368._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x15);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x15);
  local_348.data_._0_4_ = pVar4.first;
  google::
  sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>(&local_338,this_00,(int *)&local_348);
  local_2f0 = (const_reference)local_2e8;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_358,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (pair<const_int,_int> *)&local_368,local_338.pos.col_current);
  if (local_358[0] == (SelectKey)0x0) {
    testing::Message::Message((Message *)&local_338);
    if (local_350 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_350;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x530,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_368,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_368);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_338.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> + 8))();
    }
  }
  puVar1 = local_350;
  if (local_350 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_350 != local_350 + 2) {
      operator_delete((undefined8 *)*local_350);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x16);
  local_338.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_338.ht._4_4_,pVar4.first);
  pVar7 = google::
          sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_00,(int *)&local_338);
  SVar6 = (SelectKey)(pVar7.first == 0xffffffffffffffff);
  local_350 = (undefined8 *)0x0;
  local_358[0] = SVar6;
  if (!(bool)SVar6) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x532,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((pair<const_int,_int>)local_368._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    puVar1 = local_350;
    if (local_350 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_350 != local_350 + 2) {
        operator_delete((undefined8 *)*local_350);
      }
      operator_delete(puVar1);
    }
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x38);
  local_338.ht = (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)CONCAT44(local_338.ht._4_4_,pVar4.first);
  pVar7 = google::
          sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(this_00,(int *)&local_338);
  local_358[0] = (SelectKey)(pVar7.first == 0xffffffffffffffff);
  local_350 = (undefined8 *)0x0;
  if (!(bool)local_358[0]) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_338,(internal *)local_358,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",(char *)set_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x533,(char *)local_338.ht);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.ht !=
        (sparse_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)&local_338.pos.row_end) {
      operator_delete(local_338.ht);
    }
    if ((pair<const_int,_int>)local_368._0_8_ != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    puVar1 = local_350;
    if (local_350 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_350 != local_350 + 2) {
        operator_delete((undefined8 *)*local_350);
      }
      operator_delete(puVar1);
    }
  }
  local_2e8._0_8_ = &PTR__BaseHashtableInterface_00c15d98;
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)local_298);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  local_250 = &PTR__BaseHashtableInterface_00c15d98;
  std::
  vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector((vector<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_248 + 0x48));
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}